

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O2

IOTHUB_MESSAGE_RESULT
IoTHubMessage_SetComponentName(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle,char *componentName)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_MESSAGE_RESULT IVar3;
  
  if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0 || componentName == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      IVar3 = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else {
      IVar3 = IOTHUB_MESSAGE_INVALID_ARG;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_SetComponentName",0x483,1,
                "invalid arg (NULL) passed to IoTHubMessage_SetComponentName");
    }
  }
  else {
    if (iotHubMessageHandle->componentName != (char *)0x0) {
      free(iotHubMessageHandle->componentName);
      iotHubMessageHandle->componentName = (char *)0x0;
    }
    iVar1 = mallocAndStrcpy_s(&iotHubMessageHandle->componentName,componentName);
    IVar3 = (uint)(iVar1 != 0) * 3;
  }
  return IVar3;
}

Assistant:

IOTHUB_MESSAGE_RESULT IoTHubMessage_SetComponentName(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle, const char* componentName)
{
    IOTHUB_MESSAGE_RESULT result;
    if (iotHubMessageHandle == NULL || componentName == NULL)
    {
        LogError("invalid arg (NULL) passed to IoTHubMessage_SetComponentName");
        result = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else
    {
        IOTHUB_MESSAGE_HANDLE_DATA* handleData = iotHubMessageHandle;
        if (handleData->componentName != NULL)
        {
            free(handleData->componentName);
            handleData->componentName = NULL;
        }

        if (mallocAndStrcpy_s(&handleData->componentName, componentName) != 0)
        {
            result = IOTHUB_MESSAGE_ERROR;
        }
        else
        {
            result = IOTHUB_MESSAGE_OK;
        }
    }
    return result;
}